

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bind.cpp
# Opt level: O0

void __thiscall lambda_bind_mem_fn_smart_ptr_Test::TestBody(lambda_bind_mem_fn_smart_ptr_Test *this)

{
  bool bVar1;
  Type type;
  int iVar2;
  anon_class_16_1_3fcf6586 *message;
  anon_class_16_1_3fcf6586 *expected_expression;
  AssertHelper *this_00;
  offset_in_Thing_to_subr fn;
  anon_class_16_1_3fcf6586 *this_01;
  shared_ptr<Thing> sVar3;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  shared_ptr<Thing> thing;
  shared_ptr<Thing> *in_stack_fffffffffffffcc8;
  int *ps_2;
  anon_class_40_4_621f8b79 *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  anon_class_32_2_f9fac9d9 *in_stack_fffffffffffffce0;
  anon_class_16_1_3fcf6586 *actual_expression;
  shared_ptr<Thing> *in_stack_fffffffffffffce8;
  char *in_stack_fffffffffffffcf0;
  Type in_stack_fffffffffffffcfc;
  AssertHelper *in_stack_fffffffffffffd00;
  int *in_stack_fffffffffffffd20;
  AssertHelper *in_stack_fffffffffffffd50;
  AssertionResult local_268 [2];
  undefined4 local_244;
  code *local_240;
  undefined8 local_238;
  int local_22c [16];
  Type local_1ec;
  AssertionResult local_1e8 [2];
  undefined4 local_1c8;
  undefined4 local_1c4;
  code *local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined4 local_1ac;
  int local_17c;
  AssertionResult local_178 [2];
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  code *local_148;
  undefined8 local_140;
  undefined4 local_134;
  int local_104;
  AssertionResult local_100 [2];
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  code *local_d0;
  undefined8 local_c8;
  int local_9c;
  AssertionResult local_98;
  uint local_84;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  code *local_50;
  undefined8 local_48;
  anon_class_16_1_3fcf6586 *local_40;
  int local_2c;
  AssertionResult local_28 [2];
  
  sVar3 = std::make_shared<Thing>();
  local_50 = Thing::fn;
  local_48 = 0;
  message = lambda::bind<int(Thing::*)(int,int,int)>
                      ((anon_class_16_1_3fcf6586 *)Thing::fn,(lambda *)0x0,
                       (offset_in_Thing_to_subr)
                       sVar3.super___shared_ptr<Thing,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       ._M_pi);
  local_60 = 1;
  local_64 = 2;
  local_68 = 3;
  local_40 = message;
  local_2c = lambda::bind<int(Thing::*)(int,int,int)>(int(Thing::*)(int,int,int))::
             {lambda((auto:1&&)...)#1}::operator()
                       ((anon_class_16_1_3fcf6586 *)in_stack_fffffffffffffce0,
                        (shared_ptr<Thing> *)
                        CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                        (int *)in_stack_fffffffffffffcd0,(int *)in_stack_fffffffffffffcc8,
                        (int *)0x17b286);
  local_6c = 6;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,
             (int *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             (int *)in_stack_fffffffffffffcd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd00);
    testing::AssertionResult::failure_message((AssertionResult *)0x17b33f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0,
               (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),(char *)in_stack_fffffffffffffce0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd50,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x17b39c);
  }
  local_84 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b40a);
  if (local_84 == 0) {
    local_d0 = Thing::fn;
    local_c8 = 0;
    lambda::bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&>
              ((offset_in_Thing_to_subr)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    local_d4 = 1;
    local_d8 = 2;
    local_dc = 3;
    local_9c = lambda::
               bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&>(int(Thing::*)(int,int,int),std::shared_ptr<Thing>&)
               ::{lambda((auto:1&&)...)#1}::operator()
                         (in_stack_fffffffffffffce0,
                          (int *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                          (int *)in_stack_fffffffffffffcd0,(int *)in_stack_fffffffffffffcc8);
    local_e0 = 6;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((char *)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,
               (int *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
               (int *)in_stack_fffffffffffffcd0);
    lambda::
    bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&>(int(Thing::*)(int,int,int),std::shared_ptr<Thing>&)
    ::{lambda((auto:1&&)...)#1}::~bind((anon_class_32_2_f9fac9d9 *)0x17b4f9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd00);
      in_stack_fffffffffffffd20 =
           (int *)testing::AssertionResult::failure_message((AssertionResult *)0x17b588);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0,
                 (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),(char *)in_stack_fffffffffffffce0);
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd50,(Message *)message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
      testing::Message::~Message((Message *)0x17b5e5);
    }
    local_84 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b653);
    if (local_84 == 0) {
      local_134 = 1;
      local_148 = Thing::fn;
      local_140 = 0;
      lambda::bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int>
                ((offset_in_Thing_to_subr)in_stack_fffffffffffffce0,
                 (shared_ptr<Thing> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (int *)in_stack_fffffffffffffcd0);
      local_14c = 2;
      local_150 = 3;
      local_104 = lambda::
                  bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int>(int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int&&)
                  ::{lambda((auto:1&&)...)#1}::operator()
                            ((anon_class_40_3_853befe6 *)in_stack_fffffffffffffcd0,
                             (int *)in_stack_fffffffffffffcc8,(int *)0x17b6ec);
      local_154 = 6;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,
                 (int *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (int *)in_stack_fffffffffffffcd0);
      lambda::
      bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int>(int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int&&)
      ::{lambda((auto:1&&)...)#1}::~bind((anon_class_40_3_853befe6 *)0x17b742);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd00);
        testing::AssertionResult::failure_message((AssertionResult *)0x17b7d1);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0,
                   (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),(char *)in_stack_fffffffffffffce0
                  );
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd50,(Message *)message);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
        testing::Message::~Message((Message *)0x17b82e);
      }
      local_84 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b89c);
      if (local_84 == 0) {
        local_1ac = 1;
        local_1b0 = 2;
        local_1c0 = Thing::fn;
        local_1b8 = 0;
        lambda::bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int,int>
                  ((offset_in_Thing_to_subr)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                   (int *)in_stack_fffffffffffffce0,
                   (int *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        local_1c4 = 3;
        local_17c = lambda::
                    bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int,int>(int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int&&,int&&)
                    ::{lambda((auto:1&&)...)#1}::operator()
                              (in_stack_fffffffffffffcd0,(int *)in_stack_fffffffffffffcc8);
        local_1c8 = 6;
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((char *)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,
                   (int *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                   (int *)in_stack_fffffffffffffcd0);
        lambda::
        bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int,int>(int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int&&,int&&)
        ::{lambda((auto:1&&)...)#1}::~bind((anon_class_40_4_621f8b79 *)0x17b98b);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_178);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffd00);
          in_stack_fffffffffffffd00 =
               (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x17ba1a);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0,
                     (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)in_stack_fffffffffffffce0);
          testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd50,(Message *)message);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
          testing::Message::~Message((Message *)0x17ba77);
        }
        local_84 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x17bae5);
        if (local_84 == 0) {
          local_22c[2] = 1;
          local_22c[1] = 2;
          local_22c[0] = 3;
          local_240 = Thing::fn;
          local_238 = 0;
          ps_2 = local_22c;
          lambda::bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int,int,int>
                    ((offset_in_Thing_to_subr)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                     (int *)in_stack_fffffffffffffce0,
                     (int *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                     in_stack_fffffffffffffd20);
          type = anon_class_48_5_21af6246::operator()<>((anon_class_48_5_21af6246 *)0x17bb84);
          local_244 = 6;
          local_1ec = type;
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((char *)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,
                     (int *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                     (int *)in_stack_fffffffffffffcd0);
          iVar2 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
          lambda::
          bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int,int,int>(int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int&&,int&&,int&&)
          ::{lambda((auto:1&&)...)#1}::~bind((anon_class_48_5_21af6246 *)0x17bbda);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffd00);
            in_stack_fffffffffffffcf0 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x17bc69);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffd00,type,in_stack_fffffffffffffcf0,iVar2,
                       (char *)in_stack_fffffffffffffce0);
            testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd50,(Message *)message)
            ;
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffcd0);
            testing::Message::~Message((Message *)0x17bcc6);
          }
          local_84 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x17bd34);
          if (local_84 == 0) {
            expected_expression =
                 lambda::bind<int(Thing::*)(int,int,int)const>
                           ((anon_class_16_1_3fcf6586 *)Thing::cfn,(lambda *)0x0,fn);
            actual_expression = this_01;
            iVar2 = lambda::bind<int(Thing::*)(int,int,int)const>(int(Thing::*)(int,int,int)const)::
                    {lambda((auto:1&&)...)#1}::operator()
                              (this_01,(shared_ptr<Thing> *)
                                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                               ,(int *)in_stack_fffffffffffffcd0,ps_2,(int *)0x17bde9);
            testing::internal::EqHelper<false>::Compare<int,int>
                      ((char *)expected_expression,(char *)actual_expression,
                       (int *)CONCAT44(iVar2,in_stack_fffffffffffffcd8),
                       (int *)in_stack_fffffffffffffcd0);
            iVar2 = (int)((ulong)expected_expression >> 0x20);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffd00);
              this_00 = (AssertHelper *)
                        testing::AssertionResult::failure_message((AssertionResult *)0x17be9b);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffd00,type,in_stack_fffffffffffffcf0,iVar2,
                         (char *)actual_expression);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffd50,(Message *)message);
              testing::internal::AssertHelper::~AssertHelper(this_00);
              testing::Message::~Message((Message *)0x17bef8);
            }
            local_84 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x17bf63);
            if (local_84 == 0) {
              local_84 = 0;
            }
          }
        }
      }
    }
  }
  std::shared_ptr<Thing>::~shared_ptr((shared_ptr<Thing> *)0x17bf88);
  return;
}

Assistant:

TEST(lambda, bind_mem_fn_smart_ptr) {
    auto thing = std::make_shared<Thing>();

    ASSERT_EQ(lmd::bind(&Thing::fn)(thing, 1, 2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, thing)(1, 2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, thing, 1)(2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, thing, 1, 2)(3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, thing, 1, 2, 3)(), 6);

    ASSERT_EQ(lmd::bind(&Thing::cfn)(thing, 1, 2, 3), 6);
}